

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

string * __thiscall
soul::heart::Printer::PrinterStream::nameWithArray_abi_cxx11_
          (string *__return_storage_ptr__,PrinterStream *this,Identifier *name,
          optional<unsigned_int> *arraySize)

{
  uint __val;
  Module *pMVar1;
  ProgramImpl *pPVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  char cVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  uint uVar10;
  ulong uVar11;
  __string_type __str;
  long *local_88;
  ulong local_80;
  long local_78;
  undefined8 uStack_70;
  ulong *local_68;
  uint local_60;
  undefined4 uStack_5c;
  ulong local_58 [2];
  ulong *local_48;
  ulong local_40;
  ulong local_38 [2];
  
  if (*(char *)((long)&name->name + 4) != '\x01') {
    pMVar1 = this->module;
    if (pMVar1 != (Module *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pPVar2 = (pMVar1->program).pimpl;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pPVar2,
                 (long)(((pMVar1->program).refHolder.object)->constantTable).items.space +
                 (long)(pPVar2[-1].constantTable.items.space + 0x39));
      return __return_storage_ptr__;
    }
LAB_002559b1:
    throwInternalCompilerError("isValid()","toString",0x23);
  }
  pMVar1 = this->module;
  if (pMVar1 == (Module *)0x0) goto LAB_002559b1;
  pPVar2 = (pMVar1->program).pimpl;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pPVar2,
             (long)(((pMVar1->program).refHolder.object)->constantTable).items.space +
             (long)(pPVar2[-1].constantTable.items.space + 0x39));
  std::__cxx11::string::_M_replace_aux((ulong)&local_48,local_40,0,'\x01');
  __val = *(uint *)&name->name;
  cVar6 = '\x01';
  if (9 < __val) {
    uVar10 = __val;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar10 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_00255839;
      }
      if (uVar10 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_00255839;
      }
      if (uVar10 < 10000) goto LAB_00255839;
      bVar3 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar3);
    cVar6 = cVar6 + '\x01';
  }
LAB_00255839:
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_68,local_60,__val);
  local_40 = CONCAT44(uStack_5c,local_60) + local_40;
  uVar11 = 0xf;
  if (local_48 != local_38) {
    uVar11 = local_38[0];
  }
  if (uVar11 < local_40) {
    uVar11 = 0xf;
    if (local_68 != local_58) {
      uVar11 = local_58[0];
    }
    if (local_40 <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_002558ba;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
LAB_002558ba:
  local_88 = &local_78;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_78 = *plVar8;
    uStack_70 = puVar7[3];
  }
  else {
    local_78 = *plVar8;
    local_88 = (long *)*puVar7;
  }
  local_80 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_88,local_80,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar9) {
    lVar4 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string nameWithArray (const soul::Identifier& name, const std::optional<uint32_t>& arraySize)
        {
            if (arraySize.has_value())
                return name.toString() + '[' + std::to_string (*arraySize) + ']';

            return name.toString();
        }